

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_Write(ym3438_t *chip,Bit32u port,Bit8u data)

{
  Bit8u data_local;
  Bit32u port_local;
  ym3438_t *chip_local;
  
  chip->write_data = (ushort)((port & 2) << 7) | (ushort)data;
  if ((port & 1) == 0) {
    chip->write_a = chip->write_a | 1;
  }
  else {
    chip->write_d = chip->write_d | 1;
  }
  return;
}

Assistant:

void OPN2_Write(ym3438_t *chip, Bit32u port, Bit8u data)
{
    port &= 3;
    chip->write_data = ((port << 7) & 0x100) | data;
    if (port & 1)
    {
        /* Data */
        chip->write_d |= 1;
    }
    else
    {
        /* Address */
        chip->write_a |= 1;
    }
}